

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void mario::detail::resetTimerfd(int timerfd,Timestamp expiration)

{
  int iVar1;
  Writer *this;
  itimerspec oldValue;
  itimerspec local_b8;
  Writer local_90;
  
  local_b8.it_interval.tv_sec = 0;
  local_b8.it_interval.tv_nsec = 0;
  oldValue.it_interval.tv_sec = 0;
  oldValue.it_interval.tv_nsec = 0;
  oldValue.it_value.tv_sec = 0;
  oldValue.it_value.tv_nsec = 0;
  local_b8.it_value = (timespec)howMuchTimeFromNow(expiration);
  iVar1 = timerfd_settime(timerfd,0,&local_b8,(itimerspec *)&oldValue);
  if (iVar1 != 0) {
    local_90._vptr_Writer = (_func_int **)&PTR__Writer_0012afb8;
    local_90.m_msg = (LogMessage *)0x0;
    local_90.m_level = Fatal;
    local_90.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TimerQueue.cpp"
    ;
    local_90.m_line = 0x3d;
    local_90.m_func = "void mario::detail::resetTimerfd(int, Timestamp)";
    local_90.m_verboseLevel = 0;
    local_90.m_logger = (Logger *)0x0;
    local_90.m_proceed = false;
    local_90.m_messageBuilder.m_logger = (Logger *)0x0;
    local_90.m_messageBuilder.m_containerLogSeperator = "";
    local_90.m_dispatchAction = NormalLog;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = el::base::Writer::construct(&local_90,1,"default");
    el::base::Writer::operator<<(this,(char (*) [18])"timerfd_settime()");
    el::base::Writer::~Writer(&local_90);
  }
  return;
}

Assistant:

void resetTimerfd(int timerfd, Timestamp expiration) {
    struct itimerspec newValue;
    struct itimerspec oldValue;
    bzero(&newValue, sizeof(newValue));
    bzero(&oldValue, sizeof(oldValue));

    newValue.it_value = howMuchTimeFromNow(expiration);
    int ret = ::timerfd_settime(timerfd, 0, &newValue, &oldValue);
    if (ret) {
        LOG(FATAL) << "timerfd_settime()";
    }
}